

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O0

void __thiscall
Variable_removeAllEquivalencesWithDeletedVariable_Test::
~Variable_removeAllEquivalencesWithDeletedVariable_Test
          (Variable_removeAllEquivalencesWithDeletedVariable_Test *this)

{
  Variable_removeAllEquivalencesWithDeletedVariable_Test *this_local;
  
  ~Variable_removeAllEquivalencesWithDeletedVariable_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Variable, removeAllEquivalencesWithDeletedVariable)
{
    libcellml::VariablePtr v1 = libcellml::Variable::create("var1");
    libcellml::VariablePtr v2 = libcellml::Variable::create("var2");
    libcellml::VariablePtr v3 = libcellml::Variable::create("var2");

    EXPECT_TRUE(libcellml::Variable::addEquivalence(v1, v2));
    EXPECT_TRUE(libcellml::Variable::addEquivalence(v1, v3));

    EXPECT_EQ(size_t(2), v1->equivalentVariableCount());

    v3 = nullptr;

    v1->removeAllEquivalences();

    EXPECT_EQ(size_t(0), v1->equivalentVariableCount());
}